

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O0

void __thiscall
cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_delay_line<short>_>::
~cubeb_resampler_speex
          (cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_delay_line<short>_>
           *this)

{
  unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
  *in_RDI;
  
  (in_RDI->_M_t).
  super___uniq_ptr_impl<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<short>_*,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
  .super__Head_base<0UL,_cubeb_resampler_speex_one_way<short>_*,_false>._M_head_impl =
       (cubeb_resampler_speex_one_way<short> *)&PTR_fill_001cd5d0;
  std::unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_>::~unique_ptr
            ((unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_> *)in_RDI);
  std::
  unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
  ::~unique_ptr(in_RDI);
  cubeb_resampler::~cubeb_resampler((cubeb_resampler *)in_RDI);
  return;
}

Assistant:

cubeb_resampler_speex<T, InputProcessor,
                      OutputProcessor>::~cubeb_resampler_speex()
{
}